

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

string * __thiscall Matrix::ToString_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  long lVar1;
  ulong uVar2;
  int j;
  long lVar3;
  ostringstream out;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar2 = 0;
  while ((long)uVar2 < (long)this->n_) {
    lVar1 = 0;
    for (lVar3 = 0; lVar3 < this->m_; lVar3 = lVar3 + 1) {
      if (lVar1 != 0) {
        std::operator<<((ostream *)local_1a8," ");
      }
      operator<<((ostream *)local_1a8,
                 (Fraction *)
                 (*(long *)&(this->elements_).
                            super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar2].
                            super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                            super__Vector_impl_data + lVar1));
      lVar1 = lVar1 + 8;
    }
    uVar2 = uVar2 + 1;
    if (uVar2 != (uint)this->n_) {
      std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Matrix::ToString() const {
  std::ostringstream out;
  for (int i = 0; i < GetNumRows(); ++i) {
    for (int j = 0; j < GetNumColumns(); ++j) {
      if (j > 0) {
        out << " ";
      }
      out << elements_[i][j];
    }
    if (i + 1 != GetNumRows()) {
      out << std::endl;
    }
  }

  return out.str();
}